

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

uint8_t * flatbuffers::ResizeAnyVector
                    (Schema *schema,uoffset_t newsize,VectorOfAny *vec,uoffset_t num_elems,
                    uoffset_t elem_size,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,
                    Object *root_table)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  uint start;
  int delta;
  ResizeContext ctx;
  ResizeContext local_68;
  
  uVar2 = newsize - num_elems;
  delta = uVar2 * elem_size;
  puVar3 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  start = num_elems * elem_size + (int)((long)vec - (long)puVar3) + 4;
  if (delta != 0) {
    if ((int)uVar2 < 0) {
      memset(puVar3 + ((ulong)start - (ulong)(uint)-delta),0,(ulong)(uint)-delta);
    }
    ResizeContext::ResizeContext(&local_68,schema,start,delta,flatbuf,root_table);
    puVar1 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(uoffset_t *)(puVar1 + ((long)vec - (long)puVar3)) = newsize;
    if (0 < (int)uVar2) {
      memset(puVar1 + start,0,(ulong)elem_size * (ulong)uVar2);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_68.dag_check_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    puVar3 = (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  return puVar3 + start;
}

Assistant:

uint8_t *ResizeAnyVector(const reflection::Schema &schema, uoffset_t newsize,
                         const VectorOfAny *vec, uoffset_t num_elems,
                         uoffset_t elem_size, std::vector<uint8_t> *flatbuf,
                         const reflection::Object *root_table) {
  auto delta_elem = static_cast<int>(newsize) - static_cast<int>(num_elems);
  auto delta_bytes = delta_elem * static_cast<int>(elem_size);
  auto vec_start = reinterpret_cast<const uint8_t *>(vec) - flatbuf->data();
  auto start = static_cast<uoffset_t>(vec_start) +
               static_cast<uoffset_t>(sizeof(uoffset_t)) +
               elem_size * num_elems;
  if (delta_bytes) {
    if (delta_elem < 0) {
      // Clear elements we're throwing away, since some might remain in the
      // buffer.
      auto size_clear = -delta_elem * elem_size;
      memset(flatbuf->data() + start - size_clear, 0, size_clear);
    }
    ResizeContext ctx(schema, start, delta_bytes, flatbuf, root_table);
    WriteScalar(flatbuf->data() + vec_start, newsize);  // Length field.
    // Set new elements to 0.. this can be overwritten by the caller.
    if (delta_elem > 0) {
      memset(flatbuf->data() + start, 0,
             static_cast<size_t>(delta_elem) * elem_size);
    }
  }
  return flatbuf->data() + start;
}